

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

shared_ptr<(anonymous_namespace)::schema> __thiscall
anon_unknown.dwarf_1a4cc::schema::make
          (schema *this,json *schema,root_schema *root,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *uris)

{
  size_t *psVar1;
  _Rb_tree_header *__x;
  json *ptr;
  json_pointer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pjVar4;
  json_uri *pjVar5;
  _func_int **pp_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  _Alloc_hider _Var11;
  size_type sVar12;
  bool bVar13;
  iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  reference pbVar15;
  __normal_iterator<nlohmann::json_uri_*,_std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>_>
  _Var16;
  iterator iVar17;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *schema_00;
  iterator iVar18;
  pointer p_Var19;
  ulong uVar20;
  _Rb_tree_node_base *p_Var21;
  schema_file *psVar22;
  iterator iVar23;
  _Rb_tree_node_base *p_Var24;
  iterator iVar25;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
  *this_01;
  string_type *key_00;
  root_schema *__k;
  invalid_argument *piVar26;
  root_schema *__x_00;
  root_schema *prVar27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Base_ptr p_Var28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pointer field;
  iterator __pos;
  _Link_type __p;
  string *this_02;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *__args_2;
  json_uri *uri;
  pointer pjVar30;
  _Impl *this_03;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *__range2;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar31;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar32;
  shared_ptr<(anonymous_namespace)::schema> sVar33;
  initializer_list<nlohmann::json_uri> __l;
  root_schema *root_local;
  __allocator_type __a2_1;
  __allocator_type __a2;
  undefined8 uStack_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  shared_ptr<(anonymous_namespace)::schema> new_sch;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Any_data local_2a8 [10];
  undefined1 local_208 [16];
  iterator attr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1d0 [2];
  pointer local_1c0;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::schema_ref,_std::allocator<(anonymous_namespace)::schema_ref>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_1b8;
  json_uri id;
  anon_class_32_4_9864ab46 findDefinitions;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_c8;
  string local_b0;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_90;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  __position._M_current =
       (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __k = (root_schema *)keys;
  __args_2 = uris;
  root_local = root;
  while (__position._M_current !=
         (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>)._M_impl
         .super__Vector_impl_data._M_finish) {
    bVar13 = std::operator!=(&(__position._M_current)->identifier_,"");
    if (bVar13) {
      __position = std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::erase
                             (uris,__position._M_current);
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  pbVar3 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (field = (keys->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; field != pbVar3; field = field + 1) {
    pjVar4 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pjVar30 = (uris->
                   super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
                   _M_impl.super__Vector_impl_data._M_start; pjVar30 != pjVar4;
        pjVar30 = pjVar30 + 1) {
      nlohmann::json_uri::append((json_uri *)&new_sch,pjVar30,field);
      nlohmann::json_uri::operator=(pjVar30,(json_uri *)&new_sch);
      nlohmann::json_uri::~json_uri((json_uri *)&new_sch);
    }
  }
  this->_vptr_schema = (_func_int **)0x0;
  this->root_ = (root_schema *)0x0;
  if (schema->m_type != object) {
    if (schema->m_type != boolean) {
      piVar26 = (invalid_argument *)__cxa_allocate_exception(0x10);
      nlohmann::json_uri::to_string_abi_cxx11_
                ((string *)&__a2,
                 (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>)
                 ._M_impl.super__Vector_impl_data._M_start);
      std::operator+(&id.urn_,"invalid JSON-type for a schema for ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__a2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_sch,
                     &id.urn_,", expected: boolean or object");
      std::invalid_argument::invalid_argument(piVar26,(string *)&new_sch);
      __cxa_throw(piVar26,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&__a2;
    p_Var14->_M_use_count = 1;
    p_Var14->_M_weak_count = 1;
    p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00150e90;
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var14;
    schema::schema((schema *)(p_Var14 + 1),root_local);
    p_Var14[1]._vptr__Sp_counted_base = (_func_int **)&PTR_make_for_default__00150ee0;
    bVar13 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::get_impl<bool,_0>(schema);
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(bool *)&p_Var14[3]._vptr__Sp_counted_base = bVar13;
    id.urn_._M_dataplus._M_p = (pointer)(p_Var14 + 1);
    id.urn_._M_string_length = (size_type)p_Var14;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::boolean,_std::allocator<(anonymous_namespace)::boolean>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::boolean,_std::allocator<(anonymous_namespace)::boolean>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&new_sch);
    sVar12 = id.urn_._M_string_length;
    _Var11._M_p = id.urn_._M_dataplus._M_p;
    id.urn_._M_dataplus._M_p = (pointer)0x0;
    id.urn_._M_string_length = 0;
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this->_vptr_schema;
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->root_;
    this->_vptr_schema = (_func_int **)_Var11._M_p;
    this->root_ = (root_schema *)sVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_sch.
                super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&id.urn_._M_string_length);
    _Var29._M_pi = extraout_RDX;
    goto LAB_0010ab31;
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::find<const_char_(&)[4],_0>(&attr,schema,(char (*) [4])"$id");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end((iterator *)&new_sch,schema);
  bVar13 = nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::
           operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                     (&attr,(iterator *)&new_sch);
  if (bVar13) {
    pjVar30 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pjVar4 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pbVar15 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&attr);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&new_sch,pbVar15);
    _Var16 = std::
             __find_if<__gnu_cxx::__normal_iterator<nlohmann::json_uri*,std::vector<nlohmann::json_uri,std::allocator<nlohmann::json_uri>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (pjVar30,pjVar4,&new_sch);
    pjVar5 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::~string((string *)&new_sch);
    if (_Var16._M_current == pjVar5) {
      pjVar30 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&id,pbVar15);
      nlohmann::json_uri::derive
                ((json_uri *)&new_sch,(EVP_PKEY_CTX *)(pjVar30 + -1),(uchar *)&id,(size_t *)__k);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::
      emplace_back<nlohmann::json_uri>(uris,(json_uri *)&new_sch);
      nlohmann::json_uri::~json_uri((json_uri *)&new_sch);
      std::__cxx11::string::~string((string *)&id);
    }
    local_50.m_object = attr.m_object;
    local_50.m_it.object_iterator._M_node = attr.m_it.object_iterator._M_node;
    local_50.m_it.array_iterator._M_current = attr.m_it.array_iterator._M_current;
    local_50.m_it.primitive_iterator.m_it = attr.m_it.primitive_iterator.m_it;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
              ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)&new_sch,schema,&local_50);
  }
  findDefinitions.root = &root_local;
  findDefinitions.attr = &attr;
  findDefinitions.schema = schema;
  findDefinitions.uris = uris;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_sch,"$defs",(allocator<char> *)&id);
  bVar13 = make::anon_class_32_4_9864ab46::operator()(&findDefinitions,(string *)&new_sch);
  std::__cxx11::string::~string((string *)&new_sch);
  if (!bVar13) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&new_sch,"definitions",(allocator<char> *)&id);
    make::anon_class_32_4_9864ab46::operator()(&findDefinitions,(string *)&new_sch);
    std::__cxx11::string::~string((string *)&new_sch);
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::find<const_char_(&)[5],_0>((iterator *)&new_sch,schema,(char (*) [5])"$ref");
  attr.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)local_2b8._M_allocated_capacity;
  attr.m_it.primitive_iterator.m_it = local_2b8._8_8_;
  attr.m_object =
       (pointer)new_sch.
                super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  attr.m_it.object_iterator._M_node =
       (_Base_ptr)
       new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end((iterator *)&new_sch,schema);
  bVar13 = nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::
           operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                     (&attr,(iterator *)&new_sch);
  if (bVar13) {
    pjVar30 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    pbVar15 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&attr);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&new_sch,pbVar15);
    nlohmann::json_uri::derive(&id,(EVP_PKEY_CTX *)(pjVar30 + -1),(uchar *)&new_sch,(size_t *)__k);
    std::__cxx11::string::~string((string *)&new_sch);
    prVar27 = root_local;
    nlohmann::json_uri::location_abi_cxx11_((string *)&new_sch,&id);
    psVar22 = nlohmann::json_schema::root_schema::get_or_create_file(prVar27,(string *)&new_sch);
    std::__cxx11::string::~string((string *)&new_sch);
    nlohmann::json_uri::fragment_abi_cxx11_((string *)&new_sch,&id);
    __x = &(psVar22->schemas)._M_t._M_impl.super__Rb_tree_header;
    iVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
             ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                               *)(psVar22->schemas)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_parent,(_Link_type)__x,(_Base_ptr)&new_sch,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __k);
    iVar23._M_node = &__x->_M_header;
    if (((_Rb_tree_header *)iVar17._M_node != __x) &&
       (bVar13 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&new_sch,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(iVar17._M_node + 1)), iVar23 = iVar17, bVar13)) {
      iVar23._M_node = &__x->_M_header;
    }
    std::__cxx11::string::~string((string *)&new_sch);
    if ((_Rb_tree_header *)iVar23._M_node == __x) {
      this_00 = &id.pointer_;
      nlohmann::json_abi_v3_11_2::
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::to_string((string_t *)&new_sch,this_00);
      _Var29 = new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
      std::__cxx11::string::~string((string *)&new_sch);
      if (_Var29._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0010a667:
        nlohmann::json_uri::fragment_abi_cxx11_((string *)&new_sch,&id);
        __x_00 = (root_schema *)&(psVar22->unresolved)._M_t._M_impl.super__Rb_tree_header;
        iVar18 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                 ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                                   *)(psVar22->unresolved)._M_t._M_impl.super__Rb_tree_header.
                                     _M_header._M_parent,(_Link_type)__x_00,(_Base_ptr)&new_sch,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__k);
        pVar32.second = iVar18._M_node;
        pVar32.first = iVar18._M_node;
        std::__cxx11::string::~string((string *)&new_sch);
        if ((root_schema *)iVar18._M_node != __x_00) {
          nlohmann::json_uri::fragment_abi_cxx11_((string *)&new_sch,&id);
          bVar13 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&new_sch,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(iVar18._M_node + 1));
          std::__cxx11::string::~string((string *)&new_sch);
          if (!bVar13) {
            std::shared_ptr<(anonymous_namespace)::schema>::
            shared_ptr<(anonymous_namespace)::schema_ref,void>
                      ((shared_ptr<(anonymous_namespace)::schema> *)local_208,
                       (shared_ptr<(anonymous_namespace)::schema_ref> *)(iVar18._M_node + 2));
            goto LAB_0010a9bb;
          }
        }
        nlohmann::json_uri::fragment_abi_cxx11_((string *)&__a2,&id);
        nlohmann::json_uri::to_string_abi_cxx11_(&local_b0,&id);
        p_Var19 = (pointer)operator_new(0x70);
        local_1b8._M_alloc = &__a2_1;
        *(_Base_ptr *)&(p_Var19->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count =
             (_Base_ptr)0x100000001;
        (p_Var19->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00150f78;
        this_03 = &p_Var19->_M_impl;
        local_1b8._M_ptr = p_Var19;
        schema_ref::schema_ref((schema_ref *)this_03,&local_b0,prVar27);
        local_1b8._M_ptr = (pointer)0x0;
        a_Stack_1d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::schema_ref,_std::allocator<(anonymous_namespace)::schema_ref>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr(&local_1b8);
        new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)&local_2b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)___a2 == &local_2d8) {
          local_2b8._8_8_ = local_2d8._8_8_;
        }
        else {
          new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)___a2;
        }
        local_2b8._M_allocated_capacity = local_2d8._M_allocated_capacity;
        new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_2e0;
        local_2d8._M_allocated_capacity = local_2d8._M_allocated_capacity & 0xffffffffffffff00;
        local_2a8[0]._8_8_ = a_Stack_1d0[0]._M_pi;
        a_Stack_1d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ___a2 = &local_2d8;
        local_2a8[0]._0_8_ = this_03;
        if ((root_schema *)iVar18._M_node == __x_00) {
          if (((psVar22->unresolved)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (bVar13 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((psVar22->unresolved)._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_right + 1),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&new_sch), !bVar13)) {
LAB_0010a8ea:
            pVar31 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                     ::_M_get_insert_unique_pos(&(psVar22->unresolved)._M_t,(key_type *)&new_sch);
          }
          else {
            p_Var28 = (psVar22->unresolved)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_0010a8fc:
            auVar7._8_8_ = 0;
            auVar7._0_8_ = p_Var28;
            pVar31 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar7 << 0x40);
          }
LAB_0010a8fe:
          iVar18._M_node = pVar31.first;
          if (pVar31.second != (_Rb_tree_node_base *)0x0) {
LAB_0010a909:
            p_Var21 = pVar31.second;
            bVar13 = true;
            if ((__x_00 != (root_schema *)p_Var21) && (pVar31.first == (_Rb_tree_node_base *)0x0)) {
              bVar13 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&new_sch,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(p_Var21 + 1));
            }
            iVar18._M_node = (_Base_ptr)operator_new(0x50);
            std::__cxx11::string::string((string *)(iVar18._M_node + 1),(string *)&new_sch);
            uVar10 = local_2a8[0]._8_8_;
            local_2a8[0]._8_8_ = (_Base_ptr)0x0;
            *(undefined8 *)(iVar18._M_node + 2) = local_2a8[0]._M_unused._M_object;
            iVar18._M_node[2]._M_parent = (_Base_ptr)uVar10;
            local_2a8[0]._M_unused._M_object = (_Base_ptr *)0x0;
            std::_Rb_tree_insert_and_rebalance
                      (bVar13,iVar18._M_node,p_Var21,(_Rb_tree_node_base *)__x_00);
            psVar1 = &(psVar22->unresolved)._M_t._M_impl.super__Rb_tree_header._M_node_count;
            *psVar1 = *psVar1 + 1;
            uStack_2e0 = __x_00;
          }
        }
        else {
          bVar13 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&new_sch,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(iVar18._M_node + 1));
          if (bVar13) {
            p_Var28 = (psVar22->unresolved)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pVar31.second = p_Var28;
            pVar31.first = p_Var28;
            if (p_Var28 == iVar18._M_node) goto LAB_0010a8fe;
            uVar20 = std::_Rb_tree_decrement(iVar18._M_node);
            bVar13 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(uVar20 + 0x20),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&new_sch);
            if (!bVar13) goto LAB_0010a8ea;
            pVar31 = pVar32;
            if (*(long *)(uVar20 + 0x18) != 0) goto LAB_0010a8fe;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar20;
            pVar31 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar8 << 0x40);
            goto LAB_0010a909;
          }
          bVar13 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(iVar18._M_node + 1),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&new_sch);
          if (bVar13) {
            p_Var28 = (psVar22->unresolved)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            if (p_Var28 == iVar18._M_node) goto LAB_0010a8fc;
            p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar18._M_node);
            pVar31.second = p_Var21;
            pVar31.first = p_Var21;
            bVar13 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&new_sch,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var21 + 1));
            if (!bVar13) goto LAB_0010a8ea;
            if ((iVar18._M_node)->_M_right == (_Base_ptr)0x0) {
              auVar9._8_8_ = 0;
              auVar9._0_8_ = iVar18._M_node;
              pVar31 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar9 << 0x40);
              goto LAB_0010a909;
            }
            goto LAB_0010a8fe;
          }
        }
        std::shared_ptr<(anonymous_namespace)::schema>::
        shared_ptr<(anonymous_namespace)::schema_ref,void>
                  ((shared_ptr<(anonymous_namespace)::schema> *)local_208,
                   (shared_ptr<(anonymous_namespace)::schema_ref> *)(iVar18._M_node + 2));
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>
                 *)&new_sch);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1d0);
        std::__cxx11::string::~string((string *)&local_b0);
        this_02 = (string *)&__a2;
      }
      else {
        ptr = &psVar22->unknown_keywords;
        bVar13 = nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::string>::
                 contains<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           ((json_pointer<std::__cxx11::string> *)this_00,ptr);
        if (!bVar13) goto LAB_0010a667;
        schema_00 = nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::string>::
                    get_checked<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              ((json_pointer<std::__cxx11::string> *)this_00,ptr);
        ___a2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
        uStack_2e0 = (root_schema *)0x0;
        local_2d8._M_allocated_capacity = 0;
        nlohmann::json_uri::json_uri((json_uri *)&new_sch,&id);
        __l._M_len = 1;
        __l._M_array = (iterator)&new_sch;
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  (&local_c8,__l,(allocator_type *)&local_b0);
        __k = (root_schema *)&__a2;
        make((schema *)local_208,schema_00,prVar27,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__k,&local_c8);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_c8);
        nlohmann::json_uri::~json_uri((json_uri *)&new_sch);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__a2);
        if ((element_type *)local_208._0_8_ == (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
          goto LAB_0010a667;
        }
        nlohmann::json_uri::fragment_abi_cxx11_((string *)&new_sch,&id);
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        erase_internal<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                  (ptr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_sch
                  );
        this_02 = (string *)&new_sch;
        uStack_2e0 = __k;
      }
      std::__cxx11::string::~string(this_02);
      __k = (root_schema *)uStack_2e0;
    }
    else {
      std::shared_ptr<(anonymous_namespace)::schema>::shared_ptr
                ((shared_ptr<(anonymous_namespace)::schema> *)local_208,
                 (shared_ptr<(anonymous_namespace)::schema> *)(iVar23._M_node + 2));
    }
LAB_0010a9bb:
    std::shared_ptr<(anonymous_namespace)::schema>::operator=
              ((shared_ptr<(anonymous_namespace)::schema> *)this,
               (shared_ptr<(anonymous_namespace)::schema> *)local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
    local_70.m_object = attr.m_object;
    local_70.m_it.object_iterator._M_node = attr.m_it.object_iterator._M_node;
    local_70.m_it.array_iterator._M_current = attr.m_it.array_iterator._M_current;
    local_70.m_it.primitive_iterator.m_it = attr.m_it.primitive_iterator.m_it;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
              ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)&new_sch,schema,&local_70);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((iterator *)&new_sch,schema,(char (*) [8])"default");
    attr.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)local_2b8._M_allocated_capacity;
    attr.m_it.primitive_iterator.m_it = local_2b8._8_8_;
    attr.m_object =
         (pointer)new_sch.
                  super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
    attr.m_it.object_iterator._M_node =
         (_Base_ptr)
         new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end((iterator *)&new_sch,schema);
    bVar13 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       (&attr,(iterator *)&new_sch);
    prVar27 = root_local;
    if (bVar13) {
      pp_Var6 = this->_vptr_schema;
      pbVar15 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&attr);
      (**(code **)*pp_Var6)(&new_sch,pp_Var6,this,prVar27,uris,pbVar15);
      __k = prVar27;
      if (new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        std::shared_ptr<(anonymous_namespace)::schema>::operator=
                  ((shared_ptr<(anonymous_namespace)::schema> *)this,&new_sch);
        __k = prVar27;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_sch.
                  super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_90.m_object = attr.m_object;
      local_90.m_it.object_iterator._M_node = attr.m_it.object_iterator._M_node;
      local_90.m_it.array_iterator._M_current = attr.m_it.array_iterator._M_current;
      local_90.m_it.primitive_iterator.m_it = attr.m_it.primitive_iterator.m_it;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&new_sch,schema,&local_90);
    }
    nlohmann::json_uri::~json_uri(&id);
  }
  else {
    id.urn_._M_dataplus._M_p = (pointer)0x0;
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xc0);
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&__a2;
    p_Var14->_M_use_count = 1;
    p_Var14->_M_weak_count = 1;
    p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00151018;
    __k = (root_schema *)uris;
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var14;
    __gnu_cxx::new_allocator<(anonymous_namespace)::type_schema>::
    construct<(anonymous_namespace)::type_schema,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&,nlohmann::json_schema::root_schema*&,std::vector<nlohmann::json_uri,std::allocator<nlohmann::json_uri>>&>
              ((new_allocator<(anonymous_namespace)::type_schema> *)(p_Var14 + 1),
               (type_schema *)schema,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&root_local,(root_schema **)uris,__args_2);
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    id.urn_._M_dataplus._M_p = (pointer)(p_Var14 + 1);
    id.urn_._M_string_length = (size_type)p_Var14;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::type_schema,_std::allocator<(anonymous_namespace)::type_schema>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::type_schema,_std::allocator<(anonymous_namespace)::type_schema>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&new_sch);
    sVar12 = id.urn_._M_string_length;
    _Var11._M_p = id.urn_._M_dataplus._M_p;
    id.urn_._M_dataplus._M_p = (pointer)0x0;
    id.urn_._M_string_length = 0;
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this->_vptr_schema;
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->root_;
    this->_vptr_schema = (_func_int **)_Var11._M_p;
    this->root_ = (root_schema *)sVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_sch.
                super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&id.urn_._M_string_length);
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::erase_internal<const_char_(&)[8],_0>(schema,(char (*) [8])"$schema");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::erase_internal<const_char_(&)[6],_0>(schema,(char (*) [6])"title");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::erase_internal<const_char_(&)[12],_0>(schema,(char (*) [12])"description");
  _Var29._M_pi = extraout_RDX_00;
LAB_0010ab31:
  pjVar30 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_1c0 = (uris->super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  do {
    prVar27 = root_local;
    if (pjVar30 == local_1c0) {
      sVar33.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var29._M_pi;
      sVar33.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           this;
      return (shared_ptr<(anonymous_namespace)::schema>)
             sVar33.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>;
    }
    nlohmann::json_uri::location_abi_cxx11_((string *)&new_sch,pjVar30);
    psVar22 = nlohmann::json_schema::root_schema::get_or_create_file(prVar27,(string *)&new_sch);
    std::__cxx11::string::~string((string *)&new_sch);
    nlohmann::json_uri::fragment_abi_cxx11_((string *)&new_sch,pjVar30);
    prVar27 = (root_schema *)&(psVar22->schemas)._M_t._M_impl.super__Rb_tree_header;
    iVar23 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
             ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                               *)(psVar22->schemas)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_parent,(_Link_type)prVar27,(_Base_ptr)&new_sch,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __k);
    std::__cxx11::string::~string((string *)&new_sch);
    if ((root_schema *)iVar23._M_node != prVar27) {
      nlohmann::json_uri::fragment_abi_cxx11_((string *)&new_sch,pjVar30);
      bVar13 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &new_sch,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(iVar23._M_node + 1));
      std::__cxx11::string::~string((string *)&new_sch);
      if (!bVar13) {
        piVar26 = (invalid_argument *)__cxa_allocate_exception(0x10);
        nlohmann::json_uri::to_string_abi_cxx11_((string *)&__a2,pjVar30);
        std::operator+(&id.urn_,"schema with ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__a2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_sch
                       ,&id.urn_," already inserted");
        std::invalid_argument::invalid_argument(piVar26,(string *)&new_sch);
        __cxa_throw(piVar26,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
    }
    nlohmann::json_uri::fragment_abi_cxx11_(&id.urn_,pjVar30);
    paVar2 = &id.urn_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)id.urn_._M_dataplus._M_p == paVar2) {
      local_2b8._8_8_ = id.urn_.field_2._8_8_;
      new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_2b8;
    }
    else {
      new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)id.urn_._M_dataplus._M_p;
    }
    local_2b8._M_allocated_capacity._1_7_ = id.urn_.field_2._M_allocated_capacity._1_7_;
    local_2b8._M_local_buf[0] = id.urn_.field_2._M_local_buf[0];
    new_sch.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)id.urn_._M_string_length;
    id.urn_._M_string_length = 0;
    id.urn_.field_2._M_local_buf[0] = '\0';
    id.urn_._M_dataplus._M_p = (pointer)paVar2;
    std::shared_ptr<(anonymous_namespace)::schema>::shared_ptr
              ((shared_ptr<(anonymous_namespace)::schema> *)local_2a8,
               (shared_ptr<(anonymous_namespace)::schema> *)this);
    pVar32 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                         *)psVar22,(key_type *)&new_sch);
    p_Var21 = pVar32.second;
    if (p_Var21 != (_Rb_tree_node_base *)0x0) {
      bVar13 = true;
      if (prVar27 != (root_schema *)p_Var21 && pVar32.first == (_Rb_tree_node_base *)0x0) {
        bVar13 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&new_sch,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var21 + 1));
      }
      p_Var24 = (_Rb_tree_node_base *)operator_new(0x50);
      std::__cxx11::string::string((string *)(p_Var24 + 1),(string *)&new_sch);
      uVar10 = local_2a8[0]._8_8_;
      local_2a8[0]._8_8_ = (_Base_ptr)0x0;
      *(undefined8 *)(p_Var24 + 2) = local_2a8[0]._M_unused._M_object;
      p_Var24[2]._M_parent = (_Base_ptr)uVar10;
      local_2a8[0]._M_unused._M_object = (_Base_ptr *)0x0;
      std::_Rb_tree_insert_and_rebalance(bVar13,p_Var24,p_Var21,(_Rb_tree_node_base *)prVar27);
      psVar1 = &(psVar22->schemas)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar1 = *psVar1 + 1;
      __k = prVar27;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
             *)&new_sch);
    std::__cxx11::string::~string((string *)&id);
    nlohmann::json_uri::fragment_abi_cxx11_((string *)&new_sch,pjVar30);
    iVar25 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
             ::find(&psVar22->unresolved,(key_type *)&new_sch);
    std::__cxx11::string::~string((string *)&new_sch);
    __p = (_Link_type)&(psVar22->unresolved)._M_t._M_impl.super__Rb_tree_header;
    _Var29._M_pi = extraout_RDX_01;
    if ((_Link_type)iVar25._M_node != __p) {
      schema_ref::set_target
                (*(schema_ref **)(iVar25._M_node + 2),
                 (shared_ptr<(anonymous_namespace)::schema> *)this,false);
      this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
                 *)std::_Rb_tree_rebalance_for_erase(iVar25._M_node,(_Rb_tree_node_base *)__p);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema_ref>_>_>_>
      ::_M_drop_node(this_01,__p);
      psVar1 = &(psVar22->unresolved)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar1 = *psVar1 - 1;
      _Var29._M_pi = extraout_RDX_02;
    }
    if (schema->m_type == object) {
      ___a2 = schema;
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::begin((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&new_sch,
              (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&__a2);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&id,(iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&__a2);
      while (bVar13 = nlohmann::json_abi_v3_11_2::detail::
                      iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::
                      operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&new_sch,
                                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&id), prVar27 = root_local, bVar13) {
        key_00 = nlohmann::json_abi_v3_11_2::detail::
                 iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)&new_sch);
        __k = (root_schema *)
              nlohmann::json_abi_v3_11_2::detail::
              iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&new_sch);
        nlohmann::json_schema::root_schema::insert_unknown_keyword
                  (prVar27,pjVar30,key_00,(json *)__k);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)&new_sch);
      }
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&id);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&new_sch);
      _Var29._M_pi = extraout_RDX_03;
    }
    pjVar30 = pjVar30 + 1;
  } while( true );
}

Assistant:

std::shared_ptr<schema> schema::make(json &schema,
                                     root_schema *root,
                                     const std::vector<std::string> &keys,
                                     std::vector<nlohmann::json_uri> uris)
{
	// remove URIs which contain plain name identifiers, as sub-schemas cannot be referenced
	for (auto uri = uris.begin(); uri != uris.end();)
		if (uri->identifier() != "")
			uri = uris.erase(uri);
		else
			uri++;

	// append to all URIs the keys for this sub-schema
	for (auto &key : keys)
		for (auto &uri : uris)
			uri = uri.append(key);

	std::shared_ptr<::schema> sch;

	// boolean schema
	if (schema.type() == json::value_t::boolean)
		sch = std::make_shared<boolean>(schema, root);
	else if (schema.type() == json::value_t::object) {

		auto attr = schema.find("$id"); // if $id is present, this schema can be referenced by this ID
		                                // as an additional URI
		if (attr != schema.end()) {
			if (std::find(uris.begin(),
			              uris.end(),
			              attr.value().get<std::string>()) == uris.end())
				uris.push_back(uris.back().derive(attr.value().get<std::string>())); // so add it to the list if it is not there already
			schema.erase(attr);
		}

		auto findDefinitions = [&](const std::string &defs) -> bool {
			attr = schema.find(defs);
			if (attr != schema.end()) {
				for (auto &def : attr.value().items())
					schema::make(def.value(), root, {defs, def.key()}, uris);
				schema.erase(attr);
				return true;
			}
			return false;
		};
		if (!findDefinitions("$defs")) {
			findDefinitions("definitions");
		}

		attr = schema.find("$ref");
		if (attr != schema.end()) { // this schema is a reference
			// the last one on the uri-stack is the last id seen before coming here,
			// so this is the origial URI for this reference, the $ref-value has thus be resolved from it
			auto id = uris.back().derive(attr.value().get<std::string>());
			sch = root->get_or_create_ref(id);

			schema.erase(attr);

			// special case where we break draft-7 and allow overriding of properties when a $ref is used
			attr = schema.find("default");
			if (attr != schema.end()) {
				// copy the referenced schema depending on the underlying type and modify the default value
				if (auto new_sch = sch->make_for_default_(sch, root, uris, attr.value())) {
					sch = new_sch;
				}
				schema.erase(attr);
			}
		} else {
			sch = std::make_shared<type_schema>(schema, root, uris);
		}

		schema.erase("$schema");
		schema.erase("title");
		schema.erase("description");
	} else {
		throw std::invalid_argument("invalid JSON-type for a schema for " + uris[0].to_string() + ", expected: boolean or object");
	}

	for (auto &uri : uris) { // for all URIs this schema is referenced by
		root->insert(uri, sch);

		if (schema.type() == json::value_t::object)
			for (auto &u : schema.items())
				root->insert_unknown_keyword(uri, u.key(), u.value()); // insert unknown keywords for later reference
	}
	return sch;
}